

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O0

void idx2::Reverse<idx2::subband*>(subband *Beg,subband *End)

{
  subband *local_78;
  subband *It2;
  subband *It1;
  subband *End_local;
  subband *Beg_local;
  subband T;
  
  local_78 = End + -1;
  for (It2 = Beg; It2 < local_78; It2 = It2 + 1) {
    T._56_8_ = local_78;
    memcpy(&Beg_local,It2,0x40);
    memcpy(It2,(void *)T._56_8_,0x3a);
    memcpy((void *)T._56_8_,&Beg_local,0x3a);
    local_78 = local_78 + -1;
  }
  return;
}

Assistant:

void
Reverse(i Beg, i End)
{
  auto It1 = Beg;
  auto It2 = End - 1;
  while (It1 < It2)
  {
    Swap(It1, It2);
    ++It1;
    --It2;
  }
}